

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cascade.cpp
# Opt level: O2

vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> * __thiscall
Iir::Cascade::getPoleZeros
          (vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_> *__return_storage_ptr__,
          Cascade *this)

{
  int iVar1;
  Biquad *s;
  BiquadPoleState bps;
  BiquadPoleState BStack_68;
  
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::reserve
            (__return_storage_ptr__,(long)this->m_numStages);
  s = this->m_stageArray;
  for (iVar1 = this->m_numStages; 0 < iVar1; iVar1 = iVar1 + -1) {
    BiquadPoleState::BiquadPoleState(&BStack_68,s);
    std::vector<Iir::PoleZeroPair,_std::allocator<Iir::PoleZeroPair>_>::push_back
              (__return_storage_ptr__,&BStack_68.super_PoleZeroPair);
    s = s + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PoleZeroPair> Cascade::getPoleZeros () const
	{
		std::vector<PoleZeroPair> vpz;
		vpz.reserve ((unsigned long)m_numStages);

		const Biquad* stage = m_stageArray;
		for (int i = m_numStages; --i >=0;)
		{
			BiquadPoleState bps (*stage++);
			vpz.push_back (bps);
		}

		return vpz;
	}